

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void bcemit_nil(FuncState *fs,BCReg from,BCReg n)

{
  uint uVar1;
  BCInsLine *pBVar2;
  bool bVar3;
  uint uVar4;
  BCIns ins;
  uint uVar5;
  
  if (fs->pc <= fs->lasttarget) goto LAB_0011af55;
  pBVar2 = fs->bcbase;
  uVar4 = fs->pc - 1;
  uVar1 = pBVar2[uVar4].ins;
  uVar5 = uVar1 >> 8 & 0xff;
  bVar3 = true;
  if ((char)uVar1 == '*') {
    if (from <= (uVar1 >> 0x10) + 1 && uVar5 <= from) {
      uVar5 = (from + n) - 1;
      if (uVar1 >> 0x10 < uVar5) {
        *(short *)((long)&pBVar2[uVar4].ins + 2) = (short)uVar5;
      }
LAB_0011af15:
      bVar3 = false;
    }
  }
  else if (((uVar1 & 0xff) == 0x29) && (uVar1 < 0x10000)) {
    if (uVar5 == from) {
      if (n == 1) {
        n = 1;
        goto LAB_0011af15;
      }
    }
    else {
      if (uVar5 + 1 != from) goto LAB_0011af50;
      n = n + 1;
      from = uVar5;
    }
    pBVar2[uVar4].ins = (from + n) * 0x10000 - 0x10000 | from << 8 | 0x2a;
    bVar3 = false;
  }
LAB_0011af50:
  if (!bVar3) {
    return;
  }
LAB_0011af55:
  if (n == 1) {
    ins = from << 8 | 0x29;
  }
  else {
    ins = from << 8 | (from + n) * 0x10000 - 0x10000 | 0x2a;
  }
  bcemit_INS(fs,ins);
  return;
}

Assistant:

static void bcemit_nil(FuncState *fs, BCReg from, BCReg n)
{
  if (fs->pc > fs->lasttarget) {  /* No jumps to current position? */
    BCIns *ip = &fs->bcbase[fs->pc-1].ins;
    BCReg pto, pfrom = bc_a(*ip);
    switch (bc_op(*ip)) {  /* Try to merge with the previous instruction. */
    case BC_KPRI:
      if (bc_d(*ip) != ~LJ_TNIL) break;
      if (from == pfrom) {
	if (n == 1) return;
      } else if (from == pfrom+1) {
	from = pfrom;
	n++;
      } else {
	break;
      }
      *ip = BCINS_AD(BC_KNIL, from, from+n-1);  /* Replace KPRI. */
      return;
    case BC_KNIL:
      pto = bc_d(*ip);
      if (pfrom <= from && from <= pto+1) {  /* Can we connect both ranges? */
	if (from+n-1 > pto)
	  setbc_d(ip, from+n-1);  /* Patch previous instruction range. */
	return;
      }
      break;
    default:
      break;
    }
  }
  /* Emit new instruction or replace old instruction. */
  bcemit_INS(fs, n == 1 ? BCINS_AD(BC_KPRI, from, VKNIL) :
			  BCINS_AD(BC_KNIL, from, from+n-1));
}